

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FederateExport.cpp
# Opt level: O3

char * helicsFederateGetTag(HelicsFederate fed,char *tagName,HelicsError *err)

{
  Federate *this;
  FedObject *pFVar1;
  size_t sVar2;
  string *psVar3;
  char *pcVar4;
  string_view tag;
  
  pFVar1 = helics::getFedObject(fed,err);
  pcVar4 = "";
  if ((pFVar1 != (FedObject *)0x0) &&
     (this = (pFVar1->fedptr).super___shared_ptr<helics::Federate,_(__gnu_cxx::_Lock_policy)2>.
             _M_ptr, this != (Federate *)0x0)) {
    if (tagName == (char *)0x0) {
      if (err != (HelicsError *)0x0) {
        err->error_code = -4;
        err->message = "Tag name cannot be null";
      }
    }
    else {
      sVar2 = strlen(tagName);
      tag._M_str = tagName;
      tag._M_len = sVar2;
      psVar3 = helics::Federate::getTag_abi_cxx11_(this,tag);
      pcVar4 = (psVar3->_M_dataplus)._M_p;
    }
  }
  return pcVar4;
}

Assistant:

const char* helicsFederateGetTag(HelicsFederate fed, const char* tagName, HelicsError* err)
{
    auto* fedObj = getFed(fed, err);
    if (fedObj == nullptr) {
        return nullcstr;
    }
    if (tagName == nullptr) {
        assignError(err, HELICS_ERROR_INVALID_ARGUMENT, invalidTagString);
        return nullcstr;
    }
    try {
        const auto& str = fedObj->getTag(tagName);
        return str.c_str();
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
        return nullcstr;
    }
    // LCOV_EXCL_STOP
}